

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void expr_table(LexState *ls,ExpDesc *e)

{
  MSize MVar1;
  FuncState *fs;
  TValue TVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  BCPos BVar7;
  uint uVar8;
  BCReg BVar9;
  ExpKind EVar10;
  int iVar11;
  ulong uVar12;
  GCobj *gc;
  TValue *pTVar13;
  ushort uVar14;
  uint32_t uVar15;
  uint32_t hbits;
  long lVar16;
  uint uVar17;
  GCobj *o;
  BCInsLine *pBVar18;
  uint32_t asize;
  ExpDesc key;
  TValue k;
  ExpDesc val;
  anon_union_8_3_2ce71dea_for_u local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  BCPos local_78;
  BCReg local_74;
  cTValue local_70;
  anon_union_8_3_2ce71dea_for_u local_68;
  uint local_60;
  int local_5c;
  int local_58;
  BCLine local_4c;
  ulong local_48;
  ulong local_40;
  TValue *local_38;
  
  fs = ls->fs;
  local_4c = ls->linenumber;
  BVar9 = fs->freereg;
  local_40 = (ulong)(BVar9 * 0x100);
  BVar7 = bcemit_INS(fs,BVar9 * 0x100 + 0x32);
  e->k = VNONRELOC;
  (e->u).s.info = BVar9;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  asize = 1;
  bcreg_reserve(fs,1);
  local_74 = BVar9 + 1;
  lex_check(ls,0x7b);
  iVar11 = ls->token;
  local_78 = BVar7;
  if (iVar11 == 0x7d) {
    uVar17 = 0;
    bVar6 = false;
    bVar5 = false;
    bVar3 = false;
    gc = (GCobj *)0x0;
  }
  else {
    local_38 = &ls->lookaheadval;
    local_48 = (ulong)BVar7;
    asize = 1;
    gc = (GCobj *)0x0;
    bVar5 = false;
    bVar6 = false;
    uVar17 = 0;
    do {
      if (iVar11 == 0x11f) {
        iVar11 = llex(ls,local_38);
        ls->lookahead = iVar11;
        if (iVar11 == 0x3d) {
          uStack_90 = 0xffffffff00000003;
          local_98.s = local_98.s & 0xffffffff00000000;
          local_88 = 0xffffffff;
          local_98.sval = lex_str(ls);
          lex_check(ls,0x3d);
          uVar17 = uVar17 + 1;
          goto LAB_0011a096;
        }
LAB_0011a09a:
        uStack_90 = 0xffffffff00000004;
        local_88 = 0xffffffff;
        local_98 = (anon_union_8_3_2ce71dea_for_u)(double)(int)asize;
        asize = asize + 1;
        bVar5 = true;
        bVar3 = true;
      }
      else {
        if (iVar11 != 0x5b) goto LAB_0011a09a;
        expr_bracket(ls,(ExpDesc *)&local_98.s);
        if (4 < (uint)uStack_90) {
          expr_index(fs,e,(ExpDesc *)&local_98.s);
        }
        if (((uint)uStack_90 == 4) && (ABS((double)local_98.sval) == 0.0)) {
          bVar5 = true;
        }
        else {
          uVar17 = uVar17 + 1;
        }
        lex_check(ls,0x3d);
LAB_0011a096:
        bVar3 = false;
      }
      expr_binop(ls,(ExpDesc *)&local_68.s,0);
      if (((uint)uStack_90 - 1 < 4) &&
         (((uint)uStack_90 == 3 || ((local_60 < 5 && (local_5c == local_58)))))) {
        if (gc == (GCobj *)0x0) {
          uVar15 = asize;
          if (!bVar5) {
            uVar15 = 0;
          }
          uVar8 = 0x1f;
          if (uVar17 - 1 != 0) {
            for (; uVar17 - 1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          hbits = (uVar8 ^ 0xffffffe0) + 0x21;
          if (uVar17 < 2) {
            hbits = uVar17;
          }
          gc = (GCobj *)lj_tab_new(fs->L,uVar15,hbits);
          BVar9 = const_gc(fs,gc,0xfffffff4);
          fs->bcbase[local_48].ins = BVar9 << 0x10 | (uint)local_40 | 0x33;
        }
        if ((uint)uStack_90 < 3) {
          local_70.field_2.it = ~(uint)uStack_90;
        }
        else if ((uint)uStack_90 == 3) {
          local_70.field_2.it = 0xfffffffb;
          local_70.u32.lo = local_98.s.info;
        }
        else {
          local_70.u32 = (anon_struct_8_2_f9ee98fb_for_u32)local_98;
        }
        pTVar13 = lj_tab_set(fs->L,&gc->tab,&local_70);
        if (((gc->gch).marked & 4) != 0) {
          uVar12 = (ulong)(fs->L->glref).ptr32;
          (gc->gch).marked = (gc->gch).marked & 0xfb;
          (gc->gch).gclist.gcptr32 = *(uint32_t *)(uVar12 + 0x3c);
          *(uint32_t *)(uVar12 + 0x3c) = (uint32_t)gc;
        }
        if ((local_60 < 5) && (local_5c == local_58)) {
          if (local_60 < 3) {
            (pTVar13->field_2).it = ~local_60;
          }
          else if (local_60 == 3) {
            (pTVar13->u32).lo = local_68.s.info;
            (pTVar13->field_2).it = 0xfffffffb;
          }
          else {
            TVar2.field_2.it = local_68.s.aux;
            TVar2.field_2.field_0 =
                 (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
                 local_68.s.info;
            *pTVar13 = TVar2;
          }
          bVar4 = true;
        }
        else {
          (pTVar13->u32).lo = (uint32_t)gc;
          (pTVar13->field_2).it = 0xfffffff4;
          bVar6 = true;
          bVar4 = false;
        }
        bVar3 = false;
        if (!bVar4) goto LAB_0011a21e;
      }
      else {
LAB_0011a21e:
        if (local_60 != 0xd) {
          expr_toanyreg(fs,(ExpDesc *)&local_68.s);
          bVar3 = false;
        }
        if ((uint)uStack_90 < 5) {
          expr_index(fs,e,(ExpDesc *)&local_98.s);
        }
        bcemit_store(fs,e,(ExpDesc *)&local_68.s);
      }
      fs->freereg = local_74;
      if ((ls->token != 0x2c) && (ls->token != 0x3b)) break;
      lj_lex_next(ls);
      iVar11 = ls->token;
    } while (iVar11 != 0x7d);
  }
  lex_match(ls,0x7d,0x7b,local_4c);
  if (bVar3) {
    uVar8 = fs->pc - 1;
    pBVar18 = fs->bcbase + uVar8;
    local_88 = 0xffffffff;
    uStack_90 = 0xffffffff00000004;
    local_98.s.aux = 0x43300000;
    local_98.s.info = asize - 1;
    if (0x100 < asize) {
      fs->pc = uVar8;
      pBVar18 = pBVar18 + -1;
    }
    uVar8 = local_74 << 8;
    BVar9 = const_num(fs,(ExpDesc *)&local_98.s);
    pBVar18->ins = BVar9 << 0x10 | uVar8 | 0x3c;
    *(undefined1 *)((long)&pBVar18[-1].ins + 3) = 0;
  }
  EVar10 = VNONRELOC;
  if (local_78 == fs->pc - 1) {
    (e->u).s.info = local_78;
    fs->freereg = fs->freereg - 1;
    EVar10 = VRELOCABLE;
  }
  e->k = EVar10;
  if (gc == (GCobj *)0x0) {
    if (bVar5) {
      uVar14 = 3;
      if (2 < asize) {
        uVar8 = 0x7ff;
        if (asize < 0x7ff) {
          uVar8 = asize;
        }
        uVar14 = (ushort)uVar8;
      }
    }
    else {
      uVar14 = 0;
    }
    if (uVar17 != 0) {
      if (uVar17 == 1) {
        uVar17 = 0x800;
      }
      else {
        uVar8 = 0x1f;
        if (uVar17 - 1 != 0) {
          for (; uVar17 - 1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar17 = (uVar8 ^ 0x1f) * -0x800 + 0x10000;
      }
    }
    *(ushort *)((long)&fs->bcbase[local_78].ins + 2) = (ushort)uVar17 | uVar14;
  }
  else {
    if ((bVar5) && ((gc->pt).sizekgc < asize)) {
      uVar17 = (gc->pt).sizekn;
      uVar8 = 0x1f;
      if (uVar17 != 0) {
        for (; uVar17 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar15 = (uVar8 ^ 0xffffffe0) + 0x21;
      if (uVar17 == 0) {
        uVar15 = 0;
      }
      resizetab(fs->L,&gc->tab,asize,uVar15);
    }
    if (bVar6) {
      MVar1 = (gc->pt).sizekn;
      uVar17 = (gc->uv).dhash;
      lVar16 = 0;
      do {
        if (*(int *)((ulong)uVar17 + 4 + lVar16) == -0xc) {
          *(undefined4 *)((ulong)uVar17 + 4 + lVar16) = 0xffffffff;
        }
        lVar16 = lVar16 + 0x18;
      } while ((ulong)(MVar1 + 1 + (uint)(MVar1 == 0xffffffff)) * 0x18 != lVar16);
    }
    uVar12 = (ulong)(fs->L->glref).ptr32;
    if (*(uint *)(uVar12 + 0x24) <= *(uint *)(uVar12 + 0x20)) {
      lj_gc_step(fs->L);
    }
  }
  return;
}

Assistant:

static void expr_table(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  BCLine line = ls->linenumber;
  GCtab *t = NULL;
  int vcall = 0, needarr = 0, fixt = 0;
  uint32_t narr = 1;  /* First array index. */
  uint32_t nhash = 0;  /* Number of hash entries. */
  BCReg freg = fs->freereg;
  BCPos pc = bcemit_AD(fs, BC_TNEW, freg, 0);
  expr_init(e, VNONRELOC, freg);
  bcreg_reserve(fs, 1);
  freg++;
  lex_check(ls, '{');
  while (ls->token != '}') {
    ExpDesc key, val;
    vcall = 0;
    if (ls->token == '[') {
      expr_bracket(ls, &key);  /* Already calls expr_toval. */
      if (!expr_isk(&key)) expr_index(fs, e, &key);
      if (expr_isnumk(&key) && expr_numiszero(&key)) needarr = 1; else nhash++;
      lex_check(ls, '=');
    } else if ((ls->token == TK_name || (!LJ_52 && ls->token == TK_goto)) &&
	       lj_lex_lookahead(ls) == '=') {
      expr_str(ls, &key);
      lex_check(ls, '=');
      nhash++;
    } else {
      expr_init(&key, VKNUM, 0);
      setintV(&key.u.nval, (int)narr);
      narr++;
      needarr = vcall = 1;
    }
    expr(ls, &val);
    if (expr_isk(&key) && key.k != VKNIL &&
	(key.k == VKSTR || expr_isk_nojump(&val))) {
      TValue k, *v;
      if (!t) {  /* Create template table on demand. */
	BCReg kidx;
	t = lj_tab_new(fs->L, needarr ? narr : 0, hsize2hbits(nhash));
	kidx = const_gc(fs, obj2gco(t), LJ_TTAB);
	fs->bcbase[pc].ins = BCINS_AD(BC_TDUP, freg-1, kidx);
      }
      vcall = 0;
      expr_kvalue(&k, &key);
      v = lj_tab_set(fs->L, t, &k);
      lj_gc_anybarriert(fs->L, t);
      if (expr_isk_nojump(&val)) {  /* Add const key/value to template table. */
	expr_kvalue(v, &val);
      } else {  /* Otherwise create dummy string key (avoids lj_tab_newkey). */
	settabV(fs->L, v, t);  /* Preserve key with table itself as value. */
	fixt = 1;   /* Fix this later, after all resizes. */
	goto nonconst;
      }
    } else {
    nonconst:
      if (val.k != VCALL) { expr_toanyreg(fs, &val); vcall = 0; }
      if (expr_isk(&key)) expr_index(fs, e, &key);
      bcemit_store(fs, e, &val);
    }
    fs->freereg = freg;
    if (!lex_opt(ls, ',') && !lex_opt(ls, ';')) break;
  }
  lex_match(ls, '}', '{', line);
  if (vcall) {
    BCInsLine *ilp = &fs->bcbase[fs->pc-1];
    ExpDesc en;
    lua_assert(bc_a(ilp->ins) == freg &&
	       bc_op(ilp->ins) == (narr > 256 ? BC_TSETV : BC_TSETB));
    expr_init(&en, VKNUM, 0);
    en.u.nval.u32.lo = narr-1;
    en.u.nval.u32.hi = 0x43300000;  /* Biased integer to avoid denormals. */
    if (narr > 256) { fs->pc--; ilp--; }
    ilp->ins = BCINS_AD(BC_TSETM, freg, const_num(fs, &en));
    setbc_b(&ilp[-1].ins, 0);
  }
  if (pc == fs->pc-1) {  /* Make expr relocable if possible. */
    e->u.s.info = pc;
    fs->freereg--;
    e->k = VRELOCABLE;
  } else {
    e->k = VNONRELOC;  /* May have been changed by expr_index. */
  }
  if (!t) {  /* Construct TNEW RD: hhhhhaaaaaaaaaaa. */
    BCIns *ip = &fs->bcbase[pc].ins;
    if (!needarr) narr = 0;
    else if (narr < 3) narr = 3;
    else if (narr > 0x7ff) narr = 0x7ff;
    setbc_d(ip, narr|(hsize2hbits(nhash)<<11));
  } else {
    if (needarr && t->asize < narr)
      lj_tab_reasize(fs->L, t, narr-1);
    if (fixt) {  /* Fix value for dummy keys in template table. */
      Node *node = noderef(t->node);
      uint32_t i, hmask = t->hmask;
      for (i = 0; i <= hmask; i++) {
	Node *n = &node[i];
	if (tvistab(&n->val)) {
	  lua_assert(tabV(&n->val) == t);
	  setnilV(&n->val);  /* Turn value into nil. */
	}
      }
    }
    lj_gc_check(fs->L);
  }
}